

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert8BitTo24Bit
               (u8 *in,u8 *out,s32 width,s32 height,u8 *palette,s32 linepad,bool flip)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  u8 *puVar7;
  ulong uVar8;
  s32 x;
  long lVar9;
  
  if (out != (u8 *)0x0 && in != (u8 *)0x0) {
    uVar4 = (ulong)(width * 3);
    uVar5 = 0;
    uVar8 = uVar4;
    uVar2 = uVar5;
    uVar3 = uVar5;
    if (flip) {
      uVar8 = uVar5;
      uVar2 = (long)(width * 3 * height);
      uVar3 = -uVar4;
    }
    if (height < 1) {
      height = 0;
    }
    puVar7 = out + uVar2 + uVar3 + 2;
    for (; (int)uVar5 != height; uVar5 = (ulong)((int)uVar5 + 1)) {
      for (lVar9 = 0; lVar9 < (long)uVar4; lVar9 = lVar9 + 3) {
        bVar1 = *in;
        if (palette == (u8 *)0x0) {
          puVar7[lVar9 + -2] = bVar1;
          puVar7[lVar9 + -1] = bVar1;
          pbVar6 = in;
        }
        else {
          puVar7[lVar9 + -2] = palette[(ulong)bVar1 * 4 + 2];
          puVar7[lVar9 + -1] = palette[(ulong)*in * 4 + 1];
          pbVar6 = palette + (ulong)*in * 4;
        }
        puVar7[lVar9] = *pbVar6;
        in = in + 1;
      }
      in = in + linepad;
      puVar7 = puVar7 + uVar8 + uVar3;
    }
  }
  return;
}

Assistant:

void CColorConverter::convert8BitTo24Bit(const u8 *in, u8 *out, s32 width, s32 height, const u8 *palette, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	const s32 lineWidth = 3 * width;
	if (flip)
		out += lineWidth * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= lineWidth; // one line back
		for (s32 x = 0; x < lineWidth; x += 3) {
			if (palette) {
#ifdef __BIG_ENDIAN__
				out[x + 0] = palette[(in[0] << 2) + 0];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 2];
#else
				out[x + 0] = palette[(in[0] << 2) + 2];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 0];
#endif
			} else {
				out[x + 0] = in[0];
				out[x + 1] = in[0];
				out[x + 2] = in[0];
			}
			++in;
		}
		if (!flip)
			out += lineWidth;
		in += linepad;
	}
}